

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  buffer<char> *buf;
  ulong uVar7;
  char *buf_ptr;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  uint local_48 [5];
  char local_33 [3];
  char *local_30;
  
  pcVar3 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar6 = strlen(pcVar3);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar6);
  uVar7 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  pcVar3 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar6 = strlen(pcVar3);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar6);
  uVar7 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  local_30 = ::fmt::v11::detail::do_format_decimal<char,unsigned_int>((char *)local_48,uVar5,0x15);
  if ((int)uVar1 < 0) {
    local_30[-1] = '-';
    local_30 = local_30 + -1;
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_30,local_33);
  uVar7 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  uVar1 = tm_time->tm_hour;
  if (uVar1 < 100) {
    uVar7 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = (byte)(uVar1 / 10) | 0x30;
    uVar7 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_48;
    args.desc_ = 1;
    local_48[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  uVar7 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ':';
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    uVar7 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = (byte)(uVar1 / 10) | 0x30;
    uVar7 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_48;
    args_00.desc_ = 1;
    local_48[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args_00,(locale_ref)0x0);
  }
  uVar7 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ':';
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    uVar7 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = (byte)(uVar1 / 10) | 0x30;
    uVar7 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_48;
    args_01.desc_ = 1;
    local_48[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_01,args_01,(locale_ref)0x0);
  }
  uVar7 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  local_30 = ::fmt::v11::detail::do_format_decimal<char,unsigned_int>((char *)local_48,uVar5,0x15);
  if (iVar2 < -0x76c) {
    local_30[-1] = '-';
    local_30 = local_30 + -1;
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_30,local_33);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }